

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O2

bool exercise_octal::test_uintwide_t_spot_values_exercise_octal(void)

{
  uint *puVar1;
  bool bVar2;
  bool bVar3;
  local_uint128_t u_oct;
  local_uint128_t u_dec;
  stringstream strm;
  uintwide_t<128U,_unsigned_int,_void,_false> local_1e8;
  uintwide_t<128U,_unsigned_int,_void,_false> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  stringstream local_1a0 [16];
  long local_190 [3];
  uint auStack_178 [88];
  
  local_1d8.values.super_array<unsigned_int,_4UL>.elems[0] = 0x35056427;
  local_1d8.values.super_array<unsigned_int,_4UL>.elems[1] = 0x2b8a5349;
  local_1d8.values.super_array<unsigned_int,_4UL>.elems[2] = 0x72c74d82;
  local_1d8.values.super_array<unsigned_int,_4UL>.elems[3] = 0x134261;
  local_1e8.values.super_array<unsigned_int,_4UL>.elems[0] = 0x35056427;
  local_1e8.values.super_array<unsigned_int,_4UL>.elems[1] = 0x2b8a5349;
  local_1e8.values.super_array<unsigned_int,_4UL>.elems[2] = 0x72c74d82;
  local_1e8.values.super_array<unsigned_int,_4UL>.elems[3] = 0x134261;
  bVar2 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator==
                    (&local_1d8,&local_1e8);
  std::__cxx11::stringstream::stringstream(local_1a0);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 0x200;
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 0x40;
  math::wide_integer::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)local_190,&local_1e8);
  std::__cxx11::stringbuf::str();
  bVar3 = std::operator==(&local_1c0,"0464114134543515404256122464446501262047");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return bVar3 && bVar2;
}

Assistant:

auto test_uintwide_t_spot_values_exercise_octal() -> bool
  {
    #if defined(WIDE_INTEGER_NAMESPACE)
    using local_uint128_t = WIDE_INTEGER_NAMESPACE::math::wide_integer::uint128_t;
    #else
    using local_uint128_t = ::math::wide_integer::uint128_t;
    #endif

    constexpr local_uint128_t u_dec("100000000000000000000777772222211111");
    constexpr local_uint128_t u_oct("0464114134543515404256122464446501262047");

    auto result_conversion_is_ok = (u_dec == u_oct);

    static_assert(u_dec == u_oct, "Error: Conversion decimal to octal is not OK");

    std::stringstream strm;

    strm << std::showbase << std::oct << u_oct;

    result_conversion_is_ok = ((strm.str() == "0464114134543515404256122464446501262047") && result_conversion_is_ok);

    return result_conversion_is_ok;
  }